

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O0

mat4 * __thiscall rengine::mat4::inverted(mat4 *__return_storage_ptr__,mat4 *this,bool *invertible)

{
  float fVar1;
  int local_64;
  int i;
  float det;
  mat4 inv;
  bool *invertible_local;
  mat4 *this_local;
  
  inv._60_8_ = invertible;
  mat4((mat4 *)&i);
  i = (int)(-(this->m[0xd] * this->m[7]) * this->m[10] +
           this->m[0xd] * this->m[6] * this->m[0xb] +
           this->m[9] * this->m[7] * this->m[0xe] +
           -(this->m[9] * this->m[6]) * this->m[0xf] +
           this->m[5] * this->m[10] * this->m[0xf] + -(this->m[5] * this->m[0xb] * this->m[0xe]));
  inv.m[2] = this->m[0xc] * this->m[7] * this->m[10] +
             -(this->m[0xc] * this->m[6]) * this->m[0xb] +
             -(this->m[8] * this->m[7]) * this->m[0xe] +
             this->m[8] * this->m[6] * this->m[0xf] +
             -this->m[4] * this->m[10] * this->m[0xf] + this->m[4] * this->m[0xb] * this->m[0xe];
  inv.m[6] = -(this->m[0xc] * this->m[7]) * this->m[9] +
             this->m[0xc] * this->m[5] * this->m[0xb] +
             this->m[8] * this->m[7] * this->m[0xd] +
             -(this->m[8] * this->m[5]) * this->m[0xf] +
             this->m[4] * this->m[9] * this->m[0xf] + -(this->m[4] * this->m[0xb] * this->m[0xd]);
  inv.m[10] = this->m[0xc] * this->m[6] * this->m[9] +
              -(this->m[0xc] * this->m[5]) * this->m[10] +
              -(this->m[8] * this->m[6]) * this->m[0xd] +
              this->m[8] * this->m[5] * this->m[0xe] +
              -this->m[4] * this->m[9] * this->m[0xe] + this->m[4] * this->m[10] * this->m[0xd];
  det = this->m[0xd] * this->m[3] * this->m[10] +
        -(this->m[0xd] * this->m[2]) * this->m[0xb] +
        -(this->m[9] * this->m[3]) * this->m[0xe] +
        this->m[9] * this->m[2] * this->m[0xf] +
        -this->m[1] * this->m[10] * this->m[0xf] + this->m[1] * this->m[0xb] * this->m[0xe];
  inv.m[3] = -(this->m[0xc] * this->m[3]) * this->m[10] +
             this->m[0xc] * this->m[2] * this->m[0xb] +
             this->m[8] * this->m[3] * this->m[0xe] +
             -(this->m[8] * this->m[2]) * this->m[0xf] +
             this->m[0] * this->m[10] * this->m[0xf] + -(this->m[0] * this->m[0xb] * this->m[0xe]);
  inv.m[7] = this->m[0xc] * this->m[3] * this->m[9] +
             -(this->m[0xc] * this->m[1]) * this->m[0xb] +
             -(this->m[8] * this->m[3]) * this->m[0xd] +
             this->m[8] * this->m[1] * this->m[0xf] +
             -this->m[0] * this->m[9] * this->m[0xf] + this->m[0] * this->m[0xb] * this->m[0xd];
  inv.m[0xb] = -(this->m[0xc] * this->m[2]) * this->m[9] +
               this->m[0xc] * this->m[1] * this->m[10] +
               this->m[8] * this->m[2] * this->m[0xd] +
               -(this->m[8] * this->m[1]) * this->m[0xe] +
               this->m[0] * this->m[9] * this->m[0xe] + -(this->m[0] * this->m[10] * this->m[0xd]);
  inv.m[0] = -(this->m[0xd] * this->m[3]) * this->m[6] +
             this->m[0xd] * this->m[2] * this->m[7] +
             this->m[5] * this->m[3] * this->m[0xe] +
             -(this->m[5] * this->m[2]) * this->m[0xf] +
             this->m[1] * this->m[6] * this->m[0xf] + -(this->m[1] * this->m[7] * this->m[0xe]);
  inv.m[4] = this->m[0xc] * this->m[3] * this->m[6] +
             -(this->m[0xc] * this->m[2]) * this->m[7] +
             -(this->m[4] * this->m[3]) * this->m[0xe] +
             this->m[4] * this->m[2] * this->m[0xf] +
             -this->m[0] * this->m[6] * this->m[0xf] + this->m[0] * this->m[7] * this->m[0xe];
  inv.m[8] = -(this->m[0xc] * this->m[3]) * this->m[5] +
             this->m[0xc] * this->m[1] * this->m[7] +
             this->m[4] * this->m[3] * this->m[0xd] +
             -(this->m[4] * this->m[1]) * this->m[0xf] +
             this->m[0] * this->m[5] * this->m[0xf] + -(this->m[0] * this->m[7] * this->m[0xd]);
  inv.m[0xc] = this->m[0xc] * this->m[2] * this->m[5] +
               -(this->m[0xc] * this->m[1]) * this->m[6] +
               -(this->m[4] * this->m[2]) * this->m[0xd] +
               this->m[4] * this->m[1] * this->m[0xe] +
               -this->m[0] * this->m[5] * this->m[0xe] + this->m[0] * this->m[6] * this->m[0xd];
  inv.m[1] = this->m[9] * this->m[3] * this->m[6] +
             -(this->m[9] * this->m[2]) * this->m[7] +
             -(this->m[5] * this->m[3]) * this->m[10] +
             this->m[5] * this->m[2] * this->m[0xb] +
             -this->m[1] * this->m[6] * this->m[0xb] + this->m[1] * this->m[7] * this->m[10];
  inv.m[5] = -(this->m[8] * this->m[3]) * this->m[6] +
             this->m[8] * this->m[2] * this->m[7] +
             this->m[4] * this->m[3] * this->m[10] +
             -(this->m[4] * this->m[2]) * this->m[0xb] +
             this->m[0] * this->m[6] * this->m[0xb] + -(this->m[0] * this->m[7] * this->m[10]);
  inv.m[9] = this->m[8] * this->m[3] * this->m[5] +
             -(this->m[8] * this->m[1]) * this->m[7] +
             -(this->m[4] * this->m[3]) * this->m[9] +
             this->m[4] * this->m[1] * this->m[0xb] +
             -this->m[0] * this->m[5] * this->m[0xb] + this->m[0] * this->m[7] * this->m[9];
  inv.m[0xd] = -(this->m[8] * this->m[2]) * this->m[5] +
               this->m[8] * this->m[1] * this->m[6] +
               this->m[4] * this->m[2] * this->m[9] +
               -(this->m[4] * this->m[1]) * this->m[10] +
               this->m[0] * this->m[5] * this->m[10] + -(this->m[0] * this->m[6] * this->m[9]);
  fVar1 = this->m[3] * inv.m[10] +
          this->m[2] * inv.m[6] + this->m[0] * (float)i + this->m[1] * inv.m[2];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    for (local_64 = 0; local_64 < 0x10; local_64 = local_64 + 1) {
      (&i)[local_64] = (int)((1.0 / fVar1) * (float)(&i)[local_64]);
    }
    if (inv._60_8_ != 0) {
      *(undefined1 *)inv._60_8_ = 1;
    }
    memcpy(__return_storage_ptr__,&i,0x44);
  }
  else {
    if (inv._60_8_ != 0) {
      *(undefined1 *)inv._60_8_ = 0;
    }
    mat4(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

mat4 inverted(bool *invertible) const {
        mat4 inv;
        inv.m[0] = m[5]  * m[10] * m[15] -
                   m[5]  * m[11] * m[14] -
                   m[9]  * m[6]  * m[15] +
                   m[9]  * m[7]  * m[14] +
                   m[13] * m[6]  * m[11] -
                   m[13] * m[7]  * m[10];
        inv.m[4] = -m[4]  * m[10] * m[15] +
                    m[4]  * m[11] * m[14] +
                    m[8]  * m[6]  * m[15] -
                    m[8]  * m[7]  * m[14] -
                    m[12] * m[6]  * m[11] +
                    m[12] * m[7]  * m[10];
        inv.m[8] = m[4]  * m[9] * m[15] -
                   m[4]  * m[11] * m[13] -
                   m[8]  * m[5] * m[15] +
                   m[8]  * m[7] * m[13] +
                   m[12] * m[5] * m[11] -
                   m[12] * m[7] * m[9];
        inv.m[12] = -m[4]  * m[9] * m[14] +
                     m[4]  * m[10] * m[13] +
                     m[8]  * m[5] * m[14] -
                     m[8]  * m[6] * m[13] -
                     m[12] * m[5] * m[10] +
                     m[12] * m[6] * m[9];
        inv.m[1] = -m[1]  * m[10] * m[15] +
                    m[1]  * m[11] * m[14] +
                    m[9]  * m[2] * m[15] -
                    m[9]  * m[3] * m[14] -
                    m[13] * m[2] * m[11] +
                    m[13] * m[3] * m[10];
        inv.m[5] = m[0]  * m[10] * m[15] -
                   m[0]  * m[11] * m[14] -
                   m[8]  * m[2] * m[15] +
                   m[8]  * m[3] * m[14] +
                   m[12] * m[2] * m[11] -
                   m[12] * m[3] * m[10];
        inv.m[9] = -m[0]  * m[9] * m[15] +
                    m[0]  * m[11] * m[13] +
                    m[8]  * m[1] * m[15] -
                    m[8]  * m[3] * m[13] -
                    m[12] * m[1] * m[11] +
                    m[12] * m[3] * m[9];
        inv.m[13] = m[0]  * m[9] * m[14] -
                    m[0]  * m[10] * m[13] -
                    m[8]  * m[1] * m[14] +
                    m[8]  * m[2] * m[13] +
                    m[12] * m[1] * m[10] -
                    m[12] * m[2] * m[9];
        inv.m[2] = m[1]  * m[6] * m[15] -
                    m[1]  * m[7] * m[14] -
                    m[5]  * m[2] * m[15] +
                    m[5]  * m[3] * m[14] +
                    m[13] * m[2] * m[7] -
                    m[13] * m[3] * m[6];
        inv.m[6] = -m[0]  * m[6] * m[15] +
                    m[0]  * m[7] * m[14] +
                    m[4]  * m[2] * m[15] -
                    m[4]  * m[3] * m[14] -
                    m[12] * m[2] * m[7] +
                    m[12] * m[3] * m[6];
        inv.m[10] = m[0]  * m[5] * m[15] -
                    m[0]  * m[7] * m[13] -
                    m[4]  * m[1] * m[15] +
                    m[4]  * m[3] * m[13] +
                    m[12] * m[1] * m[7] -
                    m[12] * m[3] * m[5];
        inv.m[14] = -m[0]  * m[5] * m[14] +
                     m[0]  * m[6] * m[13] +
                     m[4]  * m[1] * m[14] -
                     m[4]  * m[2] * m[13] -
                     m[12] * m[1] * m[6] +
                     m[12] * m[2] * m[5];
        inv.m[3] = -m[1] * m[6] * m[11] +
                    m[1] * m[7] * m[10] +
                    m[5] * m[2] * m[11] -
                    m[5] * m[3] * m[10] -
                    m[9] * m[2] * m[7] +
                    m[9] * m[3] * m[6];
        inv.m[7] = m[0] * m[6] * m[11] -
                   m[0] * m[7] * m[10] -
                   m[4] * m[2] * m[11] +
                   m[4] * m[3] * m[10] +
                   m[8] * m[2] * m[7] -
                   m[8] * m[3] * m[6];
        inv.m[11] = -m[0] * m[5] * m[11] +
                     m[0] * m[7] * m[9] +
                     m[4] * m[1] * m[11] -
                     m[4] * m[3] * m[9] -
                     m[8] * m[1] * m[7] +
                     m[8] * m[3] * m[5];
        inv.m[15] = m[0] * m[5] * m[10] -
                    m[0] * m[6] * m[9] -
                    m[4] * m[1] * m[10] +
                    m[4] * m[2] * m[9] +
                    m[8] * m[1] * m[6] -
                    m[8] * m[2] * m[5];

        float det = m[0] * inv.m[0] + m[1] * inv.m[4] + m[2] * inv.m[8] + m[3] * inv.m[12];

        if (det == 0) {
            if (invertible)
                *invertible = false;
            return mat4();
        }

        det = 1.0 / det;
        for (int i = 0; i < 16; i++)
            inv.m[i] *= det;

        if (invertible)
            *invertible = true;

        return inv;
    }